

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O2

void gf2RedPentanomial(word *a,size_t n,gf2_pentanom_st *p)

{
  ulong *puVar1;
  byte bVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = n * 2;
  while( true ) {
    uVar5 = uVar3 - 1;
    uVar6 = a[uVar5];
    bVar2 = (byte)p->bm;
    if (uVar5 <= p->wm) break;
    uVar7 = uVar6 << (-bVar2 & 0x3f);
    if (p->bm == 0) {
      uVar7 = 0;
    }
    a[(uVar3 - 2) - p->wm] = a[(uVar3 - 2) - p->wm] ^ uVar7;
    a[uVar5 - p->wm] = a[uVar5 - p->wm] ^ uVar6 >> ((byte)p->bm & 0x3f);
    uVar7 = uVar6 << (-(char)p->bl1 & 0x3fU);
    if (p->bl1 == 0) {
      uVar7 = 0;
    }
    a[(uVar3 - 2) - p->wl1] = a[(uVar3 - 2) - p->wl1] ^ uVar7;
    a[uVar5 - p->wl1] = a[uVar5 - p->wl1] ^ uVar6 >> ((byte)p->bl1 & 0x3f);
    uVar7 = uVar6 << (-(char)p->bl & 0x3fU);
    if (p->bl == 0) {
      uVar7 = 0;
    }
    a[(uVar3 - 2) - p->wl] = a[(uVar3 - 2) - p->wl] ^ uVar7;
    a[uVar5 - p->wl] = a[uVar5 - p->wl] ^ uVar6 >> ((byte)p->bl & 0x3f);
    uVar7 = uVar6 << (-(char)p->bk & 0x3fU);
    if (p->bk == 0) {
      uVar7 = 0;
    }
    a[(uVar3 - 2) - p->wk] = a[(uVar3 - 2) - p->wk] ^ uVar7;
    a[uVar5 - p->wk] = a[uVar5 - p->wk] ^ uVar6 >> ((byte)p->bk & 0x3f);
    uVar3 = uVar5;
  }
  uVar6 = uVar6 >> (bVar2 & 0x3f);
  *a = *a ^ uVar6;
  uVar6 = uVar6 << ((byte)p->bm & 0x3f);
  uVar7 = p->wl1;
  sVar4 = p->bl1;
  if (uVar7 < uVar5) {
    if (sVar4 == 0) {
      sVar4 = 0;
    }
    else {
      a[(uVar3 - 2) - uVar7] = a[(uVar3 - 2) - uVar7] ^ uVar6 << (-(char)sVar4 & 0x3fU);
      sVar4 = p->bl1;
      uVar7 = p->wl1;
    }
  }
  a[uVar5 - uVar7] = a[uVar5 - uVar7] ^ uVar6 >> ((byte)sVar4 & 0x3f);
  sVar4 = p->bl;
  uVar7 = p->wl;
  if (uVar7 < uVar5) {
    if (sVar4 == 0) {
      sVar4 = 0;
    }
    else {
      a[(uVar3 - 2) - uVar7] = a[(uVar3 - 2) - uVar7] ^ uVar6 << (-(char)sVar4 & 0x3fU);
      sVar4 = p->bl;
      uVar7 = p->wl;
    }
  }
  a[uVar5 - uVar7] = a[uVar5 - uVar7] ^ uVar6 >> ((byte)sVar4 & 0x3f);
  sVar4 = p->bk;
  uVar7 = p->wk;
  if (uVar7 < uVar5) {
    if (sVar4 == 0) {
      sVar4 = 0;
    }
    else {
      a[(uVar3 - 2) - uVar7] = a[(uVar3 - 2) - uVar7] ^ uVar6 << (-(char)sVar4 & 0x3fU);
      sVar4 = p->bk;
      uVar7 = p->wk;
    }
  }
  puVar1 = a + uVar5;
  puVar1[-uVar7] = puVar1[-uVar7] ^ uVar6 >> ((byte)sVar4 & 0x3f);
  *puVar1 = *puVar1 ^ uVar6;
  return;
}

Assistant:

static void gf2RedPentanomial(word a[], size_t n, const gf2_pentanom_st* p)
{
	register word hi;
	// pre
	ASSERT(wwIsValid(a, 2 * n));
	ASSERT(memIsValid(p, sizeof(*p)));
	ASSERT(p->m > p->k && p->k > p->l && p->l > p->l1 && p->l1 > 0);
	ASSERT(p->k < B_PER_W);
	ASSERT(p->m - p->k >= B_PER_W);
	ASSERT(p->bm < B_PER_W && p->bk < B_PER_W);
	ASSERT(p->bl < B_PER_W && p->bl1 < B_PER_W);
	ASSERT(p->m == B_PER_W * p->wm + p->bm);
	ASSERT(p->m == p->k + B_PER_W * p->wk + p->bk);
	ASSERT(p->m == p->l + B_PER_W * p->wl + p->bl);
	ASSERT(p->m == p->l1 + B_PER_W * p->wl1 + p->bl1);
	ASSERT(n == W_OF_B(p->m));
	// обрабатываем старшие слова
	n *= 2;
	while (--n > p->wm)
	{
		hi = a[n];
		a[n - p->wm - 1] ^= p->bm ? hi << (B_PER_W - p->bm) : 0;
		a[n - p->wm] ^= hi >> p->bm;
		a[n - p->wl1 - 1] ^= p->bl1 ? hi << (B_PER_W - p->bl1) : 0;
		a[n - p->wl1] ^= hi >> p->bl1;
		a[n - p->wl - 1] ^= p->bl ? hi << (B_PER_W - p->bl) : 0;
		a[n - p->wl] ^= hi >> p->bl;
		a[n - p->wk - 1] ^= p->bk ? hi << (B_PER_W - p->bk) : 0;
		a[n - p->wk] ^= hi >> p->bk;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == p->wm);
	hi = a[n] >> p->bm;
	a[0] ^= hi;
	hi <<= p->bm;
	if (p->wl1 < n && p->bl1)
		a[n - p->wl1 - 1] ^= hi << (B_PER_W - p->bl1);
	a[n - p->wl1] ^= hi >> p->bl1;
	if (p->wl < n && p->bl)
		a[n - p->wl - 1] ^= hi << (B_PER_W - p->bl);
	a[n - p->wl] ^= hi >> p->bl;
	if (p->wk < n && p->bk)
		a[n - p->wk - 1] ^= hi << (B_PER_W - p->bk);
	a[n - p->wk] ^= hi >> p->bk;
	a[n] ^= hi;
	// очистка
	hi = 0;
}